

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cc
# Opt level: O0

void __thiscall muduo::LogFile::append(LogFile *this,char *logline,int len)

{
  bool bVar1;
  undefined4 in_EDX;
  LogFile *in_RSI;
  MutexLock *in_RDI;
  MutexLockGuard lock;
  unique_ptr<muduo::MutexLock,_std::default_delete<muduo::MutexLock>_> *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<muduo::MutexLock,_std::default_delete<muduo::MutexLock>_> *)
                     0x148984);
  if (bVar1) {
    std::unique_ptr<muduo::MutexLock,_std::default_delete<muduo::MutexLock>_>::operator*
              (in_stack_ffffffffffffffd0);
    MutexLockGuard::MutexLockGuard((MutexLockGuard *)in_stack_ffffffffffffffd0,in_RDI);
    append_unlocked(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                    in_stack_ffffffffffffffe4);
    MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x1489c2);
  }
  else {
    append_unlocked(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                    in_stack_ffffffffffffffe4);
  }
  return;
}

Assistant:

void LogFile::append(const char* logline, int len)
{
  if (mutex_)
  {
    MutexLockGuard lock(*mutex_);
    append_unlocked(logline, len);
  }
  else
  {
    append_unlocked(logline, len);
  }
}